

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

void __thiscall QDebugStateSaver::QDebugStateSaver(QDebugStateSaver *this,QDebug *dbg)

{
  _Head_base<0UL,_QDebugStateSaverPrivate_*,_false> this_00;
  
  this_00._M_head_impl = (QDebugStateSaverPrivate *)operator_new(0x30);
  QDebugStateSaverPrivate::QDebugStateSaverPrivate(this_00._M_head_impl,dbg->stream);
  (this->d)._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl = this_00._M_head_impl;
  return;
}

Assistant:

QDebugStateSaver::QDebugStateSaver(QDebug &dbg)
    : d(new QDebugStateSaverPrivate(dbg.stream))
{
}